

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void Js::DynamicProfileInfo::WriteData<char16_t_const*>(char16 **sz,PAL_FILE *file)

{
  PAL_FILE *pf;
  uint32 uVar1;
  size_t sVar2;
  HeapAllocator *alloc;
  utf8char_t *dest;
  ulong byteSize;
  uint32 lhs;
  undefined **local_60;
  size_t cbNeeded;
  ulong local_50;
  char *local_48;
  DWORD local_40;
  PAL_FILE *local_38;
  
  if (*sz == (char16_t *)0x0) {
    local_60 = (undefined **)((ulong)local_60 & 0xffffffff00000000);
    PAL_fwrite(&stack0xffffffffffffffa0,4,1,file);
  }
  else {
    local_38 = file;
    sVar2 = PAL_wcslen(*sz);
    lhs = (uint32)sVar2;
    uVar1 = UInt32Math::Mul<3u>(lhs);
    byteSize = (ulong)uVar1;
    local_60 = &unsigned_char::typeinfo;
    cbNeeded = 0;
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
    ;
    local_40 = 0x9f2;
    local_50 = byteSize;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)&stack0xffffffffffffffa0);
    dest = (utf8char_t *)new__<Memory::HeapAllocator>(byteSize,alloc,0x2f6726);
    local_60 = (undefined **)utf8::EncodeInto<(utf8::Utf8EncodingKind)0>(dest,byteSize,*sz,lhs);
    pf = local_38;
    PAL_fwrite(&stack0xffffffffffffffa0,8,1,local_38);
    PAL_fwrite(dest,1,(size_t)local_60,pf);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,dest,(ulong)(lhs * 3));
  }
  return;
}

Assistant:

void DynamicProfileInfo::WriteData<char16 const *>(char16 const * const& sz, FILE * file)
    {
        if (sz)
        {
            charcount_t len = static_cast<charcount_t>(wcslen(sz));
            const size_t cbTempBuffer = UInt32Math::Mul<3>(len);
            utf8char_t * tempBuffer = HeapNewArray(utf8char_t, cbTempBuffer);
            const size_t cbNeeded = utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>(tempBuffer, cbTempBuffer, sz, len);
            fwrite(&cbNeeded, sizeof(cbNeeded), 1, file);
            fwrite(tempBuffer, sizeof(utf8char_t), cbNeeded, file);
            HeapDeleteArray(len * 3, tempBuffer);
        }
        else
        {
            charcount_t len = 0;
            fwrite(&len, sizeof(len), 1, file);
        }
    }